

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::detail::
         stringifyBinaryExpr<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>
                   (vector<bool,_std::allocator<bool>_> *lhs,char *op,
                   vector<bool,_std::allocator<bool>_> *rhs)

{
  String *in_RDI;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff58;
  String *in_stack_ffffffffffffff70;
  String *in_stack_ffffffffffffffa0;
  String *in_stack_ffffffffffffffa8;
  
  toString<std::vector<bool,_std::allocator<bool>_>,_true>(in_stack_ffffffffffffff58);
  String::String(in_stack_ffffffffffffff70,(char *)in_RDI);
  String::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  toString<std::vector<bool,_std::allocator<bool>_>,_true>(in_stack_ffffffffffffff58);
  String::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  return in_RDI;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }